

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

uint __thiscall llvm::APInt::countLeadingOnesSlowCase(APInt *this)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar1 = this->BitWidth;
  uVar11 = uVar1 & 0x3f;
  bVar6 = 0x40 - (char)uVar11;
  uVar9 = (ulong)uVar1 + 0x3f >> 6;
  uVar10 = 0x40;
  if (uVar11 != 0) {
    uVar10 = uVar11;
  }
  if (uVar11 == 0) {
    bVar6 = 0;
  }
  uVar4 = (this->U).pVal[uVar9 - 1] << (bVar6 & 0x3f) ^ 0xffffffffffffffff;
  if (uVar4 == 0) {
    uVar5 = 0x40;
  }
  else {
    uVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x3f;
  }
  uVar11 = (uint)uVar5;
  if (0x40 < uVar1 && uVar10 == uVar11) {
    iVar7 = (int)uVar9 + -1;
    do {
      uVar9 = (this->U).pVal[iVar7 - 1];
      if (uVar9 != 0xffffffffffffffff) {
        uVar9 = ~uVar9;
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        return ((uint)lVar3 ^ 0x3f) + (int)uVar5;
      }
      uVar11 = (int)uVar5 + 0x40;
      uVar5 = (ulong)uVar11;
      iVar8 = iVar7 + -1;
      bVar2 = 0 < iVar7;
      iVar7 = iVar8;
    } while (iVar8 != 0 && bVar2);
  }
  return uVar11;
}

Assistant:

unsigned APInt::countLeadingOnesSlowCase() const {
  unsigned highWordBits = BitWidth % APINT_BITS_PER_WORD;
  unsigned shift;
  if (!highWordBits) {
    highWordBits = APINT_BITS_PER_WORD;
    shift = 0;
  } else {
    shift = APINT_BITS_PER_WORD - highWordBits;
  }
  int i = getNumWords() - 1;
  unsigned Count = llvm::countLeadingOnes(U.pVal[i] << shift);
  if (Count == highWordBits) {
    for (i--; i >= 0; --i) {
      if (U.pVal[i] == WORD_MAX)
        Count += APINT_BITS_PER_WORD;
      else {
        Count += llvm::countLeadingOnes(U.pVal[i]);
        break;
      }
    }
  }
  return Count;
}